

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

int solver2_assume(sat_solver2 *s,lit l)

{
  int iVar1;
  lit l_local;
  sat_solver2 *s_local;
  
  if (s->qtail != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                  ,0x1df,"int solver2_assume(sat_solver2 *, lit)");
  }
  iVar1 = lit_var(l);
  iVar1 = var_value(s,iVar1);
  if (iVar1 == 3) {
    veci_push(&s->trail_lim,s->qtail);
    iVar1 = solver2_enqueue(s,l,0);
    return iVar1;
  }
  __assert_fail("var_value(s, lit_var(l)) == varX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.c"
                ,0x1e0,"int solver2_assume(sat_solver2 *, lit)");
}

Assistant:

static inline int solver2_assume(sat_solver2* s, lit l)
{
    assert(s->qtail == s->qhead);
    assert(var_value(s, lit_var(l)) == varX);
#ifdef VERBOSEDEBUG
    Abc_Print(1,L_IND"assume("L_LIT")  ", L_ind, L_lit(l));
    Abc_Print(1, "act = %.20f\n", s->activity[lit_var(l)] );
#endif
    veci_push(&s->trail_lim,s->qtail);
    return solver2_enqueue(s,l,0);
}